

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

int SstFFSGetLocalDeferred
              (SstStream Stream,void *Variable,char *Name,size_t DimCount,int BlockID,size_t *Count,
              void *Data)

{
  int *piVar1;
  undefined8 *puVar2;
  void *__dest;
  long lVar3;
  FFSReaderMarshalBase *Info;
  long *plVar4;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  if (0 < (long)*piVar1) {
    lVar3 = 0;
    do {
      plVar4 = *(long **)(*(long *)(piVar1 + 2) + lVar3 * 8);
      if ((void *)*plVar4 == Variable) goto LAB_00734b82;
      lVar3 = lVar3 + 1;
    } while (*piVar1 != lVar3);
  }
  plVar4 = (long *)0x0;
LAB_00734b82:
  if (DimCount == 0) {
    memcpy(Data,(void *)(**(long **)(piVar1 + 8) + *(long *)plVar4[2]),
           (long)*(int *)((long)plVar4 + 0x24));
  }
  else {
    puVar2 = (undefined8 *)calloc(1,0x38);
    *puVar2 = plVar4;
    *(undefined4 *)(puVar2 + 1) = 1;
    puVar2[2] = (long)BlockID;
    CP_verbose(Stream,TraceVerbose,"Get request local, Name %s, BlockID %d, Count %zu\n",Name,
               (long)BlockID,*Count);
    lVar3 = plVar4[3];
    __dest = malloc(lVar3 << 3);
    puVar2[4] = __dest;
    memcpy(__dest,Count,lVar3 << 3);
    puVar2[5] = Data;
    puVar2[6] = *(undefined8 *)(piVar1 + 6);
    *(undefined8 **)(piVar1 + 6) = puVar2;
  }
  return (uint)(DimCount != 0);
}

Assistant:

extern int SstFFSGetLocalDeferred(SstStream Stream, void *Variable, const char *Name,
                                  size_t DimCount, const int BlockID, const size_t *Count,
                                  void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        memset(Req, 0, sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Local;
        Req->BlockID = BlockID;
        // make a copy of Count request
        CP_verbose(Stream, TraceVerbose, "Get request local, Name %s, BlockID %d, Count %zu\n",
                   Name, BlockID, Count[0]);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}